

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O1

void __thiscall
MockQuicTransport::MockQuicTransport(MockQuicTransport *this,UniquePtr<BIO> *bio,SSL *ssl)

{
  pointer pEVar1;
  
  (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio->_M_t).super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
  (bio->_M_t).super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar1 = (pointer)operator_new(0x80);
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_start = pEVar1;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar1 + 4;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 3) = 0;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 2) = 0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 1) = 0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)pEVar1 = 0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar1 + 4;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar1 = (pointer)operator_new(0x80);
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_start = pEVar1;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar1 + 4;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 3) = 0;
  pEVar1[3].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 2) = 0;
  pEVar1[2].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(pEVar1 + 1) = 0;
  pEVar1[1].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)pEVar1 = 0;
  (pEVar1->secret).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->write_levels_).
  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar1 + 4;
  this->ssl_ = ssl;
  return;
}

Assistant:

MockQuicTransport::MockQuicTransport(bssl::UniquePtr<BIO> bio, SSL *ssl)
    : bio_(std::move(bio)),
      read_levels_(ssl_encryption_application + 1),
      write_levels_(ssl_encryption_application + 1),
      ssl_(ssl) {}